

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
* __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::equal_range<phmap::priv::NonStandardLayout>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
           *__return_storage_ptr__,
          parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          *this,key_arg<phmap::priv::NonStandardLayout> *key)

{
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  anon_union_8_1_a8a14541_for_iterator_1 aVar2;
  anon_union_8_1_a8a14541_for_iterator_1 aVar3;
  anon_union_8_1_a8a14541_for_iterator_1 aVar4;
  anon_union_8_1_a8a14541_for_iterator_1 aVar5;
  anon_union_8_1_a8a14541_for_iterator_1 aVar6;
  bool bVar7;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
  *ppVar8;
  iterator it;
  iterator local_48;
  
  find<phmap::priv::NonStandardLayout>(&it,this,key);
  local_48.it_end_.ctrl_ = (ctrl_t *)0x0;
  local_48.inner_ = (Inner *)0x0;
  local_48.inner_end_ = (Inner *)0x0;
  local_48.it_.ctrl_ = (ctrl_t *)0x0;
  bVar7 = operator!=(&it,&local_48);
  if (bVar7) {
    local_48.it_end_.ctrl_ = (ctrl_t *)CONCAT44(it.it_end_.ctrl_._4_4_,it.it_end_.ctrl_._0_4_);
    local_48.it_end_.field_1._0_4_ = it.it_end_.field_1._0_4_;
    local_48.it_end_.field_1._4_4_ = it.it_end_.field_1._4_4_;
    local_48.it_.ctrl_ = (ctrl_t *)CONCAT44(it.it_.ctrl_._4_4_,it.it_.ctrl_._0_4_);
    local_48.it_.field_1._0_4_ = it.it_.field_1._0_4_;
    local_48.it_.field_1._4_4_ = it.it_.field_1._4_4_;
    local_48.inner_ = (Inner *)CONCAT44(it.inner_._4_4_,it.inner_._0_4_);
    local_48.inner_end_ = (Inner *)CONCAT44(it.inner_end_._4_4_,it.inner_end_._0_4_);
    std::
    __advance<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>::iterator,long>
              (&local_48,1);
    aVar5._4_4_ = local_48.it_.field_1._4_4_;
    aVar5._0_4_ = local_48.it_.field_1._0_4_;
    aVar6._4_4_ = local_48.it_end_.field_1._4_4_;
    aVar6._0_4_ = local_48.it_end_.field_1._0_4_;
    (__return_storage_ptr__->second).it_end_.ctrl_ = local_48.it_end_.ctrl_;
    (__return_storage_ptr__->second).it_end_.field_1 = aVar6;
    (__return_storage_ptr__->second).it_.ctrl_ = local_48.it_.ctrl_;
    (__return_storage_ptr__->second).it_.field_1 = aVar5;
    (__return_storage_ptr__->second).inner_ = local_48.inner_;
    (__return_storage_ptr__->second).inner_end_ = local_48.inner_end_;
    ppVar8 = __return_storage_ptr__;
  }
  else {
    aVar1._4_4_ = it.it_.field_1._4_4_;
    aVar1._0_4_ = it.it_.field_1._0_4_;
    aVar3._4_4_ = it.it_end_.field_1._4_4_;
    aVar3._0_4_ = it.it_end_.field_1._0_4_;
    (__return_storage_ptr__->first).it_end_.ctrl_ =
         (ctrl_t *)CONCAT44(it.it_end_.ctrl_._4_4_,it.it_end_.ctrl_._0_4_);
    (__return_storage_ptr__->first).it_end_.field_1 = aVar3;
    (__return_storage_ptr__->first).it_.ctrl_ =
         (ctrl_t *)CONCAT44(it.it_.ctrl_._4_4_,it.it_.ctrl_._0_4_);
    (__return_storage_ptr__->first).it_.field_1 = aVar1;
    (__return_storage_ptr__->first).inner_ = (Inner *)CONCAT44(it.inner_._4_4_,it.inner_._0_4_);
    (__return_storage_ptr__->first).inner_end_ =
         (Inner *)CONCAT44(it.inner_end_._4_4_,it.inner_end_._0_4_);
    ppVar8 = (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::iterator>
              *)&__return_storage_ptr__->second;
  }
  aVar2._4_4_ = it.it_.field_1._4_4_;
  aVar2._0_4_ = it.it_.field_1._0_4_;
  aVar4._4_4_ = it.it_end_.field_1._4_4_;
  aVar4._0_4_ = it.it_end_.field_1._0_4_;
  (ppVar8->first).it_end_.ctrl_ = (ctrl_t *)CONCAT44(it.it_end_.ctrl_._4_4_,it.it_end_.ctrl_._0_4_);
  (ppVar8->first).it_end_.field_1 = aVar4;
  (ppVar8->first).it_.ctrl_ = (ctrl_t *)CONCAT44(it.it_.ctrl_._4_4_,it.it_.ctrl_._0_4_);
  (ppVar8->first).it_.field_1 = aVar2;
  (ppVar8->first).inner_ = (Inner *)CONCAT44(it.inner_._4_4_,it.inner_._0_4_);
  (ppVar8->first).inner_end_ = (Inner *)CONCAT44(it.inner_end_._4_4_,it.inner_end_._0_4_);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key) {
        auto it = find(key);
        if (it != end()) return {it, std::next(it)};
        return {it, it};
    }